

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetProperty
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type TVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  code *pcVar3;
  Var value_00;
  DynamicObject *instance_00;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 in_register_00000084;
  ushort uVar7;
  uint32 local_5c;
  Var pvStack_58;
  uint32 indexVal;
  undefined8 local_50;
  PropertyValueInfo *local_48;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *local_40;
  DynamicObject *local_38;
  
  local_50 = CONCAT44(in_register_00000084,flags);
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  pvStack_58 = value;
  local_48 = info;
  local_38 = instance;
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar4)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = scriptContext->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  if (0 < this->propertyCount) {
    uVar7 = 0;
    do {
      if ((this->descriptors[uVar7].Id.ptr)->pid == propertyId) {
        local_40 = &this->descriptors[uVar7].field_1;
        if ((local_40->Attributes & 8) == 0) {
          if ((local_40->Attributes & 4) == 0) {
            JavascriptError::ThrowCantAssignIfStrictMode
                      ((PropertyOperationFlags)local_50,scriptContext);
            if (local_48 == (PropertyValueInfo *)0x0) {
              return 0;
            }
            TVar1 = local_40->Attributes;
            local_48->m_instance = &local_38->super_RecyclableObject;
            local_48->m_propertyIndex = uVar7;
            local_48->m_attributes = TVar1;
            local_48->flags = InlineCacheNoFlags;
            return 0;
          }
        }
        else {
          if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                        ,0x23a,"(!GetIsLocked())","!GetIsLocked()");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar6 = 0;
          }
          local_40->Attributes = '\a';
          DynamicObject::SetHasNoEnumerableProperties(local_38,false);
        }
        instance_00 = local_38;
        value_00 = pvStack_58;
        DynamicTypeHandler::SetSlotUnchecked(local_38,(uint)uVar7,pvStack_58);
        if (local_48 != (PropertyValueInfo *)0x0) {
          TVar1 = local_40->Attributes;
          local_48->m_instance = &instance_00->super_RecyclableObject;
          local_48->m_propertyIndex = uVar7;
          local_48->m_attributes = TVar1;
          local_48->flags = InlineCacheNoFlags;
        }
        DynamicTypeHandler::SetPropertyUpdateSideEffect
                  (&this->super_DynamicTypeHandler,instance_00,propertyId,value_00,SideEffects_Any);
        return 1;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)uVar7 < (uint)this->propertyCount);
  }
  BVar5 = ScriptContext::IsNumericPropertyId(scriptContext,propertyId,&local_5c);
  if (BVar5 == 0) {
    BVar5 = AddProperty(this,local_38,propertyId,pvStack_58,'\a',local_48,
                        (PropertyOperationFlags)local_50,SideEffects_Any);
  }
  else {
    BVar5 = DynamicTypeHandler::SetItem
                      (&this->super_DynamicTypeHandler,local_38,local_5c,pvStack_58,
                       (PropertyOperationFlags)local_50);
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                descriptors[index].Attributes = PropertyDynamicTypeDefaults;
                instance->SetHasNoEnumerableProperties(false);
            }
            else if (!(descriptors[index].Attributes & PropertyWritable))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes); // Try to cache property info even if not writable
                return false;
            }

            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
            return true;
        }

        // Always check numeric propertyId. This may create objectArray.
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItem(instance, indexVal, value, flags);
        }

        return this->AddProperty(instance, propertyId, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }